

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaIf.c
# Opt level: O0

Gia_Man_t * Gia_ManPerformMappingInt(Gia_Man_t *p,If_Par_t *pPars)

{
  char cVar1;
  int iVar2;
  int iVar3;
  float *pfVar4;
  If_Man_t *pIfMan_00;
  If_DsdMan_t *pIVar5;
  Tim_Man_t *pTVar6;
  Vec_Int_t *pVVar7;
  If_Obj_t *pIVar8;
  char *pcVar9;
  If_Par_t *pIVar10;
  float fVar11;
  bool local_69;
  If_Obj_t *pIfObj;
  If_DsdMan_t *p_1;
  int Entry;
  int i;
  If_Man_t *pIfMan;
  Gia_Man_t *pNew;
  If_Par_t *pPars_local;
  Gia_Man_t *p_local;
  
  if (pPars->pTimesArr != (float *)0x0) {
    __assert_fail("pPars->pTimesArr == NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/gia/giaIf.c"
                  ,0x8d8,"Gia_Man_t *Gia_ManPerformMappingInt(Gia_Man_t *, If_Par_t *)");
  }
  if (pPars->pTimesReq != (float *)0x0) {
    __assert_fail("pPars->pTimesReq == NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/gia/giaIf.c"
                  ,0x8d9,"Gia_Man_t *Gia_ManPerformMappingInt(Gia_Man_t *, If_Par_t *)");
  }
  if (p->vCiArrs != (Vec_Int_t *)0x0) {
    iVar2 = Vec_IntSize(p->vCiArrs);
    iVar3 = Gia_ManCiNum(p);
    if (iVar2 != iVar3) {
      __assert_fail("Vec_IntSize(p->vCiArrs) == Gia_ManCiNum(p)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/gia/giaIf.c"
                    ,0x8dc,"Gia_Man_t *Gia_ManPerformMappingInt(Gia_Man_t *, If_Par_t *)");
    }
    iVar2 = Gia_ManCiNum(p);
    pfVar4 = (float *)calloc((long)iVar2,4);
    pPars->pTimesArr = pfVar4;
    for (p_1._4_4_ = 0; iVar2 = Vec_IntSize(p->vCiArrs), p_1._4_4_ < iVar2;
        p_1._4_4_ = p_1._4_4_ + 1) {
      iVar2 = Vec_IntEntry(p->vCiArrs,p_1._4_4_);
      pPars->pTimesArr[p_1._4_4_] = (float)iVar2;
    }
  }
  if (p->vCoReqs != (Vec_Int_t *)0x0) {
    iVar2 = Vec_IntSize(p->vCoReqs);
    iVar3 = Gia_ManCoNum(p);
    if (iVar2 != iVar3) {
      __assert_fail("Vec_IntSize(p->vCoReqs) == Gia_ManCoNum(p)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/gia/giaIf.c"
                    ,0x8ec,"Gia_Man_t *Gia_ManPerformMappingInt(Gia_Man_t *, If_Par_t *)");
    }
    iVar2 = Gia_ManCoNum(p);
    pfVar4 = (float *)calloc((long)iVar2,4);
    pPars->pTimesReq = pfVar4;
    for (p_1._4_4_ = 0; iVar2 = Vec_IntSize(p->vCoReqs), p_1._4_4_ < iVar2;
        p_1._4_4_ = p_1._4_4_ + 1) {
      iVar2 = Vec_IntEntry(p->vCoReqs,p_1._4_4_);
      pPars->pTimesReq[p_1._4_4_] = (float)iVar2;
    }
  }
  if (p->pCellStr != (char *)0x0) {
    free(p->pCellStr);
    p->pCellStr = (char *)0x0;
  }
  Vec_IntFreeP(&p->vConfigs);
  if ((((((pPars->fDelayOpt == 0) && (pPars->fDelayOptLut == 0)) && (pPars->fDsdBalance == 0)) &&
       ((pPars->fUserRecLib == 0 && (pPars->fUserSesLib == 0)))) &&
      ((pPars->fDeriveLuts == 0 && ((pPars->fUseDsd == 0 && (pPars->fUseTtPerm == 0)))))) &&
     (pPars->pFuncCell2 == (_func_int_If_Man_t_ptr_word_ptr_int_Vec_Str_t_ptr_char_ptr_ptr *)0x0)) {
    pPars->fCutMin = 0;
  }
  pIfMan_00 = Gia_ManToIf(p,pPars);
  if (pIfMan_00 == (If_Man_t *)0x0) {
    p_local = (Gia_Man_t *)0x0;
  }
  else {
    if (pPars->fUseDsd != 0) {
      pIVar5 = (If_DsdMan_t *)Abc_FrameReadManDsd();
      iVar2 = pPars->nLutSize;
      iVar3 = If_DsdManVarNum(pIVar5);
      if (iVar3 < iVar2) {
        __assert_fail("pPars->nLutSize <= If_DsdManVarNum(p)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/gia/giaIf.c"
                      ,0x907,"Gia_Man_t *Gia_ManPerformMappingInt(Gia_Man_t *, If_Par_t *)");
      }
      if (((pPars->pLutStruct != (char *)0x0) || (iVar2 = If_DsdManLutSize(pIVar5), iVar2 != 0)) &&
         ((pPars->pLutStruct == (char *)0x0 ||
          (cVar1 = *pPars->pLutStruct, iVar2 = If_DsdManLutSize(pIVar5), cVar1 + -0x30 != iVar2))))
      {
        __assert_fail("(pPars->pLutStruct == NULL && If_DsdManLutSize(p) == 0) || (pPars->pLutStruct && pPars->pLutStruct[0] - \'0\' == If_DsdManLutSize(p))"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/gia/giaIf.c"
                      ,0x908,"Gia_Man_t *Gia_ManPerformMappingInt(Gia_Man_t *, If_Par_t *)");
      }
      pIVar5 = (If_DsdMan_t *)Abc_FrameReadManDsd();
      pIfMan_00->pIfDsdMan = pIVar5;
      if (pPars->fDsdBalance != 0) {
        If_DsdManAllocIsops(pIfMan_00->pIfDsdMan,pPars->nLutSize);
      }
    }
    if (pPars->fPower != 0) {
      if (p->pManTime == (void *)0x0) {
        If_ManComputeSwitching(pIfMan_00);
      }
      else {
        Abc_Print(0,"Switching activity computation for designs with boxes is disabled.\n");
      }
    }
    if (pPars->pReoMan != (void *)0x0) {
      pIfMan_00->pUserMan = pPars->pReoMan;
    }
    if (p->pManTime != (void *)0x0) {
      local_69 = true;
      if ((((pPars->fDelayOpt == 0) && (local_69 = true, pPars->fDelayOptLut == 0)) &&
          (local_69 = true, pPars->fDsdBalance == 0)) && (local_69 = true, pPars->fUserRecLib == 0))
      {
        local_69 = pPars->fUserSesLib != 0;
      }
      pTVar6 = Tim_ManDup((Tim_Man_t *)p->pManTime,(uint)local_69);
      pIfMan_00->pManTim = pTVar6;
    }
    if (p->vCoAttrs != (Vec_Int_t *)0x0) {
      iVar2 = If_ManCoNum(pIfMan_00);
      iVar3 = Vec_IntSize(p->vCoAttrs);
      if (iVar2 != iVar3) {
        __assert_fail("If_ManCoNum(pIfMan) == Vec_IntSize(p->vCoAttrs)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/gia/giaIf.c"
                      ,0x91c,"Gia_Man_t *Gia_ManPerformMappingInt(Gia_Man_t *, If_Par_t *)");
      }
      for (p_1._4_4_ = 0; iVar2 = Vec_IntSize(p->vCoAttrs), p_1._4_4_ < iVar2;
          p_1._4_4_ = p_1._4_4_ + 1) {
        iVar2 = Vec_IntEntry(p->vCoAttrs,p_1._4_4_);
        pIVar8 = If_ManCo(pIfMan_00,p_1._4_4_);
        pIVar8 = If_ObjFanin0(pIVar8);
        *(uint *)pIVar8 = *(uint *)pIVar8 & 0xfffffbff | (uint)(iVar2 != 0) << 10;
      }
    }
    iVar2 = If_ManPerformMapping(pIfMan_00);
    if (iVar2 == 0) {
      If_ManStop(pIfMan_00);
      p_local = (Gia_Man_t *)0x0;
    }
    else {
      if (pPars->pFuncWrite != (_func_int_If_Man_t_ptr *)0x0) {
        (*pPars->pFuncWrite)(pIfMan_00);
      }
      if (((pIfMan_00->pPars->fDelayOpt == 0) && (pIfMan_00->pPars->fDsdBalance == 0)) &&
         ((pIfMan_00->pPars->fUserRecLib == 0 && (pIfMan_00->pPars->fUserSesLib == 0)))) {
        pIfMan = (If_Man_t *)Gia_ManFromIfLogic(pIfMan_00);
      }
      else {
        pIfMan = (If_Man_t *)Gia_ManFromIfAig(pIfMan_00);
      }
      if ((p->vCiArrs != (Vec_Int_t *)0x0) || (p->vCoReqs != (Vec_Int_t *)0x0)) {
        Vec_IntFreeP(&p->vCoArrs);
        iVar2 = Gia_ManCoNum(p);
        pVVar7 = Vec_IntAlloc(iVar2);
        p->vCoArrs = pVVar7;
        for (p_1._4_4_ = 0; iVar2 = Vec_PtrSize(pIfMan_00->vCos), p_1._4_4_ < iVar2;
            p_1._4_4_ = p_1._4_4_ + 1) {
          pIVar8 = (If_Obj_t *)Vec_PtrEntry(pIfMan_00->vCos,p_1._4_4_);
          pVVar7 = p->vCoArrs;
          pIVar8 = If_ObjFanin0(pIVar8);
          fVar11 = If_ObjArrTime(pIVar8);
          Vec_IntPush(pVVar7,(int)fVar11);
        }
      }
      If_ManStop(pIfMan_00);
      if (pIfMan->pName != (char *)0x0) {
        __assert_fail("pNew->pName == NULL",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/gia/giaIf.c"
                      ,0x936,"Gia_Man_t *Gia_ManPerformMappingInt(Gia_Man_t *, If_Par_t *)");
      }
      pcVar9 = Abc_UtilStrsav(p->pName);
      pIfMan->pName = pcVar9;
      pIVar10 = (If_Par_t *)Abc_UtilStrsav(p->pSpec);
      pIfMan->pPars = pIVar10;
      iVar2 = Gia_ManRegNum(p);
      Gia_ManSetRegNum((Gia_Man_t *)pIfMan,iVar2);
      if (pPars->fVerboseTrace != 0) {
        *(If_LibLut_t **)&pIfMan->nSetBytes = pPars->pLutLib;
        Gia_ManDelayTraceLutPrint((Gia_Man_t *)pIfMan,1);
        *(undefined8 *)&pIfMan->nSetBytes = 0;
      }
      p_local = (Gia_Man_t *)pIfMan;
    }
  }
  return p_local;
}

Assistant:

Gia_Man_t * Gia_ManPerformMappingInt( Gia_Man_t * p, If_Par_t * pPars )
{
    extern void Gia_ManIffTest( Gia_Man_t * pGia, If_LibLut_t * pLib, int fVerbose );
    Gia_Man_t * pNew;
    If_Man_t * pIfMan; int i, Entry;//, Id, EntryF;
    assert( pPars->pTimesArr == NULL );
    assert( pPars->pTimesReq == NULL );
    if ( p->vCiArrs )
    {
        assert( Vec_IntSize(p->vCiArrs) == Gia_ManCiNum(p) );
        pPars->pTimesArr = ABC_CALLOC( float, Gia_ManCiNum(p) );
        Vec_IntForEachEntry( p->vCiArrs, Entry, i )
            pPars->pTimesArr[i] = (float)Entry;
    }
/*  // uncommenting this leads to a mysterious memory corruption 
    else if ( p->vInArrs )
    {
        assert( Vec_FltSize(p->vInArrs) == Gia_ManCiNum(p) );
        pPars->pTimesArr = ABC_CALLOC( float, Gia_ManCiNum(p));
        Gia_ManForEachCiId( p, Id, i )
            pPars->pTimesArr[i] = Vec_FltEntry(p->vInArrs, i);
    }
*/
    if ( p->vCoReqs )
    {
        assert( Vec_IntSize(p->vCoReqs) == Gia_ManCoNum(p) );
        pPars->pTimesReq = ABC_CALLOC( float, Gia_ManCoNum(p) );
        Vec_IntForEachEntry( p->vCoReqs, Entry, i )
            pPars->pTimesReq[i] = (float)Entry;
    }
/*  // uncommenting this leads to a mysterious memory corruption 
    else if ( p->vOutReqs )
    {
        assert( Vec_FltSize(p->vOutReqs) == Gia_ManCoNum(p) );
        pPars->pTimesReq = ABC_CALLOC( float, Gia_ManCoNum(p) );
        Vec_FltForEachEntry( p->vOutReqs, EntryF, i )
            pPars->pTimesReq[i] = EntryF;
    }
*/
    ABC_FREE( p->pCellStr );
    Vec_IntFreeP( &p->vConfigs );
    // disable cut minimization when GIA strucure is needed
    if ( !pPars->fDelayOpt && !pPars->fDelayOptLut && !pPars->fDsdBalance && !pPars->fUserRecLib && !pPars->fUserSesLib && !pPars->fDeriveLuts && !pPars->fUseDsd && !pPars->fUseTtPerm && !pPars->pFuncCell2 )
        pPars->fCutMin = 0;
    // translate into the mapper
    pIfMan = Gia_ManToIf( p, pPars );    
    if ( pIfMan == NULL )
        return NULL;
    // create DSD manager
    if ( pPars->fUseDsd )
    {
        If_DsdMan_t * p = (If_DsdMan_t *)Abc_FrameReadManDsd();
        assert( pPars->nLutSize <= If_DsdManVarNum(p) );
        assert( (pPars->pLutStruct == NULL && If_DsdManLutSize(p) == 0) || (pPars->pLutStruct && pPars->pLutStruct[0] - '0' == If_DsdManLutSize(p)) );
        pIfMan->pIfDsdMan = (If_DsdMan_t *)Abc_FrameReadManDsd();
        if ( pPars->fDsdBalance )
            If_DsdManAllocIsops( pIfMan->pIfDsdMan, pPars->nLutSize );
    }
    // compute switching for the IF objects
    if ( pPars->fPower )
    {
        if ( p->pManTime == NULL )
            If_ManComputeSwitching( pIfMan );
        else
            Abc_Print( 0, "Switching activity computation for designs with boxes is disabled.\n" );
    }
    if ( pPars->pReoMan )
        pIfMan->pUserMan = pPars->pReoMan;
    if ( p->pManTime )
        pIfMan->pManTim = Tim_ManDup( (Tim_Man_t *)p->pManTime, pPars->fDelayOpt || pPars->fDelayOptLut || pPars->fDsdBalance || pPars->fUserRecLib || pPars->fUserSesLib );
//    Tim_ManPrint( pIfMan->pManTim );
    if ( p->vCoAttrs )
    {
        assert( If_ManCoNum(pIfMan) == Vec_IntSize(p->vCoAttrs) );
        Vec_IntForEachEntry( p->vCoAttrs, Entry, i )
            If_ObjFanin0( If_ManCo(pIfMan, i) )->fSpec = (Entry != 0);
    }
    if ( !If_ManPerformMapping( pIfMan ) )
    {
        If_ManStop( pIfMan );
        return NULL;
    }
    if ( pPars->pFuncWrite )
        pPars->pFuncWrite( pIfMan );
    // transform the result of mapping into the new network
    if ( pIfMan->pPars->fDelayOpt || pIfMan->pPars->fDsdBalance || pIfMan->pPars->fUserRecLib || pIfMan->pPars->fUserSesLib )
        pNew = Gia_ManFromIfAig( pIfMan );
    else
        pNew = Gia_ManFromIfLogic( pIfMan );
    if ( p->vCiArrs || p->vCoReqs )
    {
        If_Obj_t * pIfObj = NULL;
        Vec_IntFreeP( &p->vCoArrs );
        p->vCoArrs = Vec_IntAlloc( Gia_ManCoNum(p) );
        If_ManForEachCo( pIfMan, pIfObj, i )
            Vec_IntPush( p->vCoArrs, (int)If_ObjArrTime(If_ObjFanin0(pIfObj)) );
    }
    If_ManStop( pIfMan );
    // transfer name
    assert( pNew->pName == NULL );
    pNew->pName = Abc_UtilStrsav( p->pName );
    pNew->pSpec = Abc_UtilStrsav( p->pSpec );
    Gia_ManSetRegNum( pNew, Gia_ManRegNum(p) );
    // print delay trace
    if ( pPars->fVerboseTrace )
    {
        pNew->pLutLib = pPars->pLutLib;
        Gia_ManDelayTraceLutPrint( pNew, 1 );
        pNew->pLutLib = NULL;
    }
    return pNew;
}